

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

bool cfd::core::Pubkey::IsValid(ByteData *byte_data)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38 [7];
  uint8_t header;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  ByteData *byte_data_local;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,byte_data);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
  if (sVar2 != 0) {
    pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_38,0);
    vVar1 = *pvVar3;
    if ((vVar1 == '\x02') || (vVar1 == '\x03')) {
      sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
      byte_data_local._7_1_ = sVar2 == 0x21;
      goto LAB_0044eaba;
    }
    if (((vVar1 == '\x04') || (vVar1 == '\x06')) || (vVar1 == '\a')) {
      sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_38);
      byte_data_local._7_1_ = sVar2 == 0x41;
      goto LAB_0044eaba;
    }
  }
  byte_data_local._7_1_ = false;
LAB_0044eaba:
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffffd0);
  return byte_data_local._7_1_;
}

Assistant:

bool Pubkey::IsValid(const ByteData &byte_data) {
  const std::vector<uint8_t> &buffer = byte_data.GetBytes();
  if (buffer.size() > 0) {
    uint8_t header = buffer[0];
    if (header == 0x02 || header == 0x03) {
      return buffer.size() == Pubkey::kCompressedPubkeySize;
    } else if (header == 0x04 || header == 0x06 || header == 0x07) {
      return buffer.size() == Pubkey::kPubkeySize;
    }
  }
  return false;
}